

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

void Exp_Truth8(int nVars,Vec_Int_t *p,word **puFanins,word *puRes)

{
  int Lit;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  word wVar6;
  ulong local_1e0;
  void *local_1d8;
  void *local_1d0;
  ulong local_1b0;
  word *pIn1;
  word *pIn0;
  int fCompl1;
  int fCompl0;
  int iVar1;
  int iVar0;
  int iRoot;
  int k;
  int i;
  word *pThis;
  word *pStore;
  word *puFaninsInt [8];
  word Truth8 [8] [4];
  word *puRes_local;
  word **puFanins_local;
  Vec_Int_t *p_local;
  int nVars_local;
  
  memcpy(puFaninsInt + 7,&DAT_00d676e0,0x100);
  _k = (void *)0x0;
  Lit = Vec_IntEntryLast(p);
  puRes_local = (word *)puFanins;
  if (puFanins == (word **)0x0) {
    puRes_local = (word *)&pStore;
    for (iVar0 = 0; iVar0 < 8; iVar0 = iVar0 + 1) {
      ((word **)puRes_local)[iVar0] = Truth8[(long)iVar0 + -1] + 3;
    }
  }
  iVar2 = Exp_NodeNum(p);
  if (iVar2 == 0) {
    if (SBORROW4(Lit,nVars * 2) == Lit + nVars * -2 < 0) {
      __assert_fail("iRoot < 2 * nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    if ((Lit == -1) || (Lit == -2)) {
      for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
        wVar6 = 0xffffffffffffffff;
        if (Lit == -1) {
          wVar6 = 0;
        }
        puRes[iVar0] = wVar6;
      }
    }
    else {
      for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
        iVar2 = Abc_LitIsCompl(Lit);
        if (iVar2 == 0) {
          iVar2 = Abc_Lit2Var(Lit);
          local_1b0 = *(ulong *)(puRes_local[iVar2] + (long)iVar0 * 8);
        }
        else {
          iVar2 = Abc_Lit2Var(Lit);
          local_1b0 = *(ulong *)(puRes_local[iVar2] + (long)iVar0 * 8) ^ 0xffffffffffffffff;
        }
        puRes[iVar0] = local_1b0;
      }
    }
  }
  else {
    iVar2 = Exp_NodeNum(p);
    __ptr = calloc((long)(iVar2 << 2),8);
    for (iRoot = 0; iVar2 = Exp_NodeNum(p), iRoot < iVar2; iRoot = iRoot + 1) {
      iVar2 = Vec_IntEntry(p,iRoot << 1);
      iVar2 = Abc_Lit2Var(iVar2);
      iVar3 = Vec_IntEntry(p,iRoot * 2 + 1);
      iVar3 = Abc_Lit2Var(iVar3);
      iVar4 = Vec_IntEntry(p,iRoot << 1);
      iVar4 = Abc_LitIsCompl(iVar4);
      iVar5 = Vec_IntEntry(p,iRoot * 2 + 1);
      iVar5 = Abc_LitIsCompl(iVar5);
      if (iVar2 < nVars) {
        local_1d0 = (void *)puRes_local[iVar2];
      }
      else {
        local_1d0 = (void *)((long)__ptr + (long)((iVar2 - nVars) * 4) * 8);
      }
      if (iVar3 < nVars) {
        local_1d8 = (void *)puRes_local[iVar3];
      }
      else {
        local_1d8 = (void *)((long)__ptr + (long)((iVar3 - nVars) * 4) * 8);
      }
      _k = (void *)((long)__ptr + (long)(iRoot << 2) * 8);
      if ((iVar4 == 0) || (iVar5 == 0)) {
        if ((iVar4 == 0) || (iVar5 != 0)) {
          if ((iVar4 == 0) && (iVar5 != 0)) {
            for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
              *(ulong *)((long)_k + (long)iVar0 * 8) =
                   *(ulong *)((long)local_1d0 + (long)iVar0 * 8) &
                   (*(ulong *)((long)local_1d8 + (long)iVar0 * 8) ^ 0xffffffffffffffff);
            }
          }
          else {
            for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
              *(ulong *)((long)_k + (long)iVar0 * 8) =
                   *(ulong *)((long)local_1d0 + (long)iVar0 * 8) &
                   *(ulong *)((long)local_1d8 + (long)iVar0 * 8);
            }
          }
        }
        else {
          for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
            *(ulong *)((long)_k + (long)iVar0 * 8) =
                 (*(ulong *)((long)local_1d0 + (long)iVar0 * 8) ^ 0xffffffffffffffff) &
                 *(ulong *)((long)local_1d8 + (long)iVar0 * 8);
          }
        }
      }
      else {
        for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
          *(ulong *)((long)_k + (long)iVar0 * 8) =
               (*(ulong *)((long)local_1d0 + (long)iVar0 * 8) ^ 0xffffffffffffffff) &
               (*(ulong *)((long)local_1d8 + (long)iVar0 * 8) ^ 0xffffffffffffffff);
        }
      }
    }
    iVar2 = Abc_Lit2Var(Lit);
    if (iVar2 - nVars != iRoot + -1) {
      __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    for (iVar0 = 0; iVar0 < 4; iVar0 = iVar0 + 1) {
      iVar2 = Abc_LitIsCompl(Lit);
      if (iVar2 == 0) {
        local_1e0 = *(ulong *)((long)_k + (long)iVar0 * 8);
      }
      else {
        local_1e0 = *(ulong *)((long)_k + (long)iVar0 * 8) ^ 0xffffffffffffffff;
      }
      puRes[iVar0] = local_1e0;
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

static inline void Exp_Truth8( int nVars, Vec_Int_t * p, word ** puFanins, word * puRes )
{
    word Truth8[8][4] = {
        { ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA) },
        { ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC) },
        { ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0) },
        { ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00) },
        { ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000) },
        { ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0xFFFFFFFFFFFFFFFF) }
    };
    word * puFaninsInt[8], * pStore, * pThis = NULL;
    int i, k, iRoot = Vec_IntEntryLast(p);
    if ( puFanins == NULL )
    {
        puFanins = puFaninsInt;
        for ( k = 0; k < 8; k++ )
            puFanins[k] = Truth8[k];
    }
    if ( Exp_NodeNum(p) == 0 )
    {
        assert( iRoot < 2 * nVars );
        if ( iRoot == EXP_CONST0 || iRoot == EXP_CONST1 )
            for ( k = 0; k < 4; k++ )
                puRes[k] = iRoot == EXP_CONST0 ? 0 : ~(word)0;
        else
            for ( k = 0; k < 4; k++ )
                puRes[k] = Abc_LitIsCompl(iRoot) ? ~puFanins[Abc_Lit2Var(iRoot)][k] : puFanins[Abc_Lit2Var(iRoot)][k];
        return;
    }
    pStore = ABC_CALLOC( word, 4 * Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
    {
        int iVar0 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+0) );
        int iVar1 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+1) );
        int fCompl0 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+0) );
        int fCompl1 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+1) );
        word * pIn0 = iVar0 < nVars ? puFanins[iVar0] : pStore + 4 * (iVar0 - nVars);
        word * pIn1 = iVar1 < nVars ? puFanins[iVar1] : pStore + 4 * (iVar1 - nVars);
        pThis = pStore + 4 * i;
        if ( fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] & ~pIn1[k];
        else if ( fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] &  pIn1[k];
        else if ( !fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] & ~pIn1[k];
        else //if ( !fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] &  pIn1[k];
    }
    assert( Abc_Lit2Var(iRoot) - nVars == i - 1 );
    for ( k = 0; k < 4; k++ )
        puRes[k] = Abc_LitIsCompl(iRoot) ? ~pThis[k] : pThis[k];
    ABC_FREE( pStore );
}